

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

HairMaterial * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
          (polymorphic_allocator<std::byte> *this,SpectrumTextureHandle *args,
          SpectrumTextureHandle *args_1,FloatTextureHandle *args_2,FloatTextureHandle *args_3,
          FloatTextureHandle *args_4,FloatTextureHandle *args_5,FloatTextureHandle *args_6,
          FloatTextureHandle *args_7)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x40,8);
  construct<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
            (this,(HairMaterial *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,args_4,
             args_5,args_6,args_7);
  return (HairMaterial *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }